

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

int stbi__bmp_info(stbi__context *s,int *x,int *y,int *comp)

{
  void *pvVar1;
  undefined4 uVar2;
  undefined4 *in_RCX;
  stbi__uint32 *in_RDX;
  stbi__uint32 *in_RSI;
  stbi__context *in_RDI;
  stbi__bmp_data info;
  void *p;
  int local_54;
  stbi__bmp_data *in_stack_ffffffffffffffb0;
  stbi__context *in_stack_ffffffffffffffb8;
  int local_3c;
  int local_4;
  
  pvVar1 = stbi__bmp_parse_header(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  stbi__rewind(in_RDI);
  if (pvVar1 == (void *)0x0) {
    local_4 = 0;
  }
  else {
    if (in_RSI != (stbi__uint32 *)0x0) {
      *in_RSI = in_RDI->img_x;
    }
    if (in_RDX != (stbi__uint32 *)0x0) {
      *in_RDX = in_RDI->img_y;
    }
    if (in_RCX != (undefined4 *)0x0) {
      if ((local_54 == 0x18) && (local_3c == -0x1000000)) {
        *in_RCX = 3;
      }
      else {
        uVar2 = 3;
        if (local_3c != 0) {
          uVar2 = 4;
        }
        *in_RCX = uVar2;
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int stbi__bmp_info(stbi__context *s, int *x, int *y, int *comp)
{
   void *p;
   stbi__bmp_data info;

   info.all_a = 255;
   p = stbi__bmp_parse_header(s, &info);
   stbi__rewind( s );
   if (p == NULL)
      return 0;
   if (x) *x = s->img_x;
   if (y) *y = s->img_y;
   if (comp) {
      if (info.bpp == 24 && info.ma == 0xff000000)
         *comp = 3;
      else
         *comp = info.ma ? 4 : 3;
   }
   return 1;
}